

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

void TPZShapeHCurlNoGrads<pzshape::TPZShapeLinear>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  double dVar1;
  int *piVar2;
  double *pdVar3;
  long in_RSI;
  int x_1;
  int x;
  int fss;
  int ie;
  int fcount;
  TPZFMatrix<double> curlphi_unfilt;
  TPZFMatrix<double> phi_unfilt;
  int i;
  int n_unfilt;
  TPZManVector<int,_1> first_hcurl_side;
  TPZManVector<int,_27> *connectorders;
  int nedges;
  int curldim;
  int dim;
  int ncon;
  int nsides;
  int ncorner;
  TPZManVector<int,_1> *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  TPZFMatrix<double> *in_stack_fffffffffffffdc0;
  int64_t in_stack_fffffffffffffdc8;
  TPZManVector<int,_1> *in_stack_fffffffffffffdd0;
  double dVar4;
  int64_t in_stack_fffffffffffffdd8;
  TPZFMatrix<double> *in_stack_fffffffffffffde0;
  TPZFMatrix<double> *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  TPZShapeData *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  int local_1b4;
  int local_1b0;
  int local_1a8;
  int local_80;
  int local_70;
  TPZVec<int> local_68;
  TPZVec<int> *local_40;
  int local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  long local_10;
  
  local_24 = 2;
  local_28 = 3;
  local_2c = 1;
  local_30 = 1;
  local_34 = 1;
  local_10 = in_RSI;
  local_38 = pztopology::TPZLine::NumSides(0x18d19e8);
  local_40 = (TPZVec<int> *)(local_10 + 0x2b50);
  TPZManVector<int,_1>::TPZManVector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(int *)in_stack_fffffffffffffdc0);
  TPZVec<int>::operator[](local_40,0);
  local_70 = TPZShapeHCurl<pzshape::TPZShapeLinear>::ComputeNConnectShapeF
                       ((int)in_stack_fffffffffffffdc0,
                        (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  for (local_80 = 1; local_80 < 1; local_80 = local_80 + 1) {
    in_stack_fffffffffffffe04 = local_70;
    piVar2 = TPZVec<int>::operator[](&local_68,(long)local_80);
    *piVar2 = in_stack_fffffffffffffe04;
    in_stack_fffffffffffffdf4 = local_80;
    in_stack_fffffffffffffdf8 = (TPZShapeData *)TPZVec<int>::operator[](local_40,(long)local_80);
    in_stack_fffffffffffffdf0 =
         TPZShapeHCurl<pzshape::TPZShapeLinear>::ComputeNConnectShapeF
                   ((int)in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    local_70 = in_stack_fffffffffffffdf0 + local_70;
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(int64_t)in_stack_fffffffffffffdd0)
  ;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(int64_t)in_stack_fffffffffffffdd0)
  ;
  TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape
            ((TPZVec<double> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8);
  for (local_1a8 = 0; local_1a8 < local_38; local_1a8 = local_1a8 + 1) {
    TPZVec<int>::operator[](&local_68,(long)local_1a8);
    for (local_1b0 = 0; local_1b0 < 1; local_1b0 = local_1b0 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffdc0,(int64_t)in_stack_fffffffffffffdb8,
                          (int64_t)in_stack_fffffffffffffdb0);
      dVar4 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffdc0,(int64_t)in_stack_fffffffffffffdb8,
                          (int64_t)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffdc0 = (TPZFMatrix<double> *)(dVar4 + *pdVar3);
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffdc0,(int64_t)in_stack_fffffffffffffdb8,
                          (int64_t)in_stack_fffffffffffffdb0);
      *pdVar3 = (double)in_stack_fffffffffffffdc0;
    }
    for (local_1b4 = 0; local_1b4 < 1; local_1b4 = local_1b4 + 1) {
      in_stack_fffffffffffffdb8 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffdc0,(int64_t)in_stack_fffffffffffffdb8,
                      (int64_t)in_stack_fffffffffffffdb0);
      dVar4 = *in_stack_fffffffffffffdb8;
      in_stack_fffffffffffffdb0 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffdc0,(int64_t)in_stack_fffffffffffffdb8,
                      (int64_t)in_stack_fffffffffffffdb0);
      dVar1 = *in_stack_fffffffffffffdb0;
      in_stack_fffffffffffffda0 =
           (TPZManVector<int,_1> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffdc0,(int64_t)in_stack_fffffffffffffdb8,
                      (int64_t)in_stack_fffffffffffffdb0);
      (in_stack_fffffffffffffda0->super_TPZVec<int>)._vptr_TPZVec = (_func_int **)(dVar4 + dVar1);
    }
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d1e0d);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d1e1a);
  TPZManVector<int,_1>::~TPZManVector(in_stack_fffffffffffffda0);
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}